

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

Vec_Int_t * Gia_ManStgReadLines(char *pFileName,int *pnIns,int *pnOuts,int *pnStates)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *pFile;
  int nStates;
  int nOutputs;
  int nInputs;
  int Number;
  char *pToken;
  char pBuffer [1000];
  Vec_Int_t *vLines;
  int *pnStates_local;
  int *pnOuts_local;
  int *pnIns_local;
  char *pFileName_local;
  
  nStates = -1;
  pFile._4_4_ = -1;
  pFile._0_4_ = 1;
  sVar3 = strlen(pFileName);
  iVar1 = strcmp(pFileName + (sVar3 - 3),"aig");
  if (iVar1 == 0) {
    printf("Input file \"%s\" has extension \"%s\".\n",pFileName,"aig");
    pFileName_local = (char *)0x0;
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      printf("Cannot open file \"%s\".\n",pFileName);
      pFileName_local = (char *)0x0;
    }
    else {
      pFileName_local = (char *)Vec_IntAlloc(1000);
      while (pcVar4 = fgets((char *)&pToken,1000,__stream), pcVar4 != (char *)0x0) {
        if (((char)pToken != '.') && ((char)pToken != '#')) {
          pcVar4 = strtok((char *)&pToken," \r\n");
          if (nStates == -1) {
            sVar3 = strlen(pcVar4);
            nStates = (int)sVar3;
          }
          else {
            sVar3 = strlen(pcVar4);
            if (nStates != (int)sVar3) {
              __assert_fail("nInputs == (int)strlen(pToken)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStg.c"
                            ,0x1d4,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
            }
          }
          uVar2 = Extra_ReadBinary(pcVar4);
          Vec_IntPush((Vec_Int_t *)pFileName_local,uVar2);
          pcVar4 = strtok((char *)0x0," \r\n");
          iVar1 = atoi(pcVar4);
          Vec_IntPush((Vec_Int_t *)pFileName_local,iVar1);
          iVar1 = Vec_IntEntryLast((Vec_Int_t *)pFileName_local);
          pFile._0_4_ = Abc_MaxInt((int)pFile,iVar1 + 1);
          pcVar4 = strtok((char *)0x0," \r\n");
          iVar1 = atoi(pcVar4);
          Vec_IntPush((Vec_Int_t *)pFileName_local,iVar1);
          pcVar4 = strtok((char *)0x0," \r\n");
          if (pFile._4_4_ == -1) {
            sVar3 = strlen(pcVar4);
            pFile._4_4_ = (int)sVar3;
          }
          else {
            sVar3 = strlen(pcVar4);
            if (pFile._4_4_ != (int)sVar3) {
              __assert_fail("nOutputs == (int)strlen(pToken)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStg.c"
                            ,0x1e3,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
            }
          }
          uVar2 = Extra_ReadBinary(pcVar4);
          Vec_IntPush((Vec_Int_t *)pFileName_local,uVar2);
        }
      }
      fclose(__stream);
      if (pnIns != (int *)0x0) {
        *pnIns = nStates;
      }
      if (pnOuts != (int *)0x0) {
        *pnOuts = pFile._4_4_;
      }
      if (pnStates != (int *)0x0) {
        *pnStates = (int)pFile;
      }
    }
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Gia_ManStgReadLines( char * pFileName, int * pnIns, int * pnOuts, int * pnStates )
{
    Vec_Int_t * vLines;
    char pBuffer[1000];
    char * pToken;
    int Number, nInputs = -1, nOutputs = -1, nStates = 1;
    FILE * pFile;
    if ( !strcmp(pFileName + strlen(pFileName) - 3, "aig") )
    {
        printf( "Input file \"%s\" has extension \"%s\".\n", pFileName, "aig" );
        return NULL;
    }
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Vec_IntAlloc( 1000 );
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[0] == '.' || pBuffer[0] == '#' )
            continue;
        // read condition
        pToken = strtok( pBuffer, " \r\n" );
        if ( nInputs == -1 )
            nInputs = strlen(pToken);
        else
            assert( nInputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
        // read current state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        nStates = Abc_MaxInt( nStates, Vec_IntEntryLast(vLines)+1 );
        // read next state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        // read output
        pToken = strtok( NULL, " \r\n" );
        if ( nOutputs == -1 )
            nOutputs = strlen(pToken);
        else
            assert( nOutputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
    }
    fclose( pFile );
    if ( pnIns )
        *pnIns = nInputs;
    if ( pnOuts )
        *pnOuts = nOutputs;
    if ( pnStates )
        *pnStates = nStates;
    return vLines;
}